

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O0

Vec_Int_t * Cec_ManSatSolveMiter(Gia_Man_t *pAig,Cec_ParSat_t *pPars,Vec_Str_t **pvStatus)

{
  FILE *pFile;
  int iVar1;
  abctime aVar2;
  Vec_Str_t *p_00;
  Vec_Int_t *vCexStore_00;
  Cec_ManSat_t *p_01;
  Bar_Progress_t *p_02;
  Gia_Obj_t *pGVar3;
  abctime aVar4;
  bool bVar5;
  abctime clk;
  int status;
  int i;
  Gia_Obj_t *pObj;
  Cec_ManSat_t *p;
  Vec_Str_t *vStatus;
  Vec_Int_t *vCexStore;
  Bar_Progress_t *pProgress;
  Vec_Str_t **pvStatus_local;
  Cec_ParSat_t *pPars_local;
  Gia_Man_t *pAig_local;
  
  aVar2 = Abc_Clock();
  Gia_ManSetPhase(pAig);
  Gia_ManLevelNum(pAig);
  Gia_ManIncrementTravId(pAig);
  iVar1 = Gia_ManPoNum(pAig);
  p_00 = Vec_StrAlloc(iVar1);
  vCexStore_00 = Vec_IntAlloc(10000);
  p_01 = Cec_ManSatCreate(pAig,pPars);
  pFile = _stdout;
  iVar1 = Gia_ManPoNum(pAig);
  p_02 = Bar_ProgressStart(pFile,iVar1);
  clk._4_4_ = 0;
  while( true ) {
    iVar1 = Vec_IntSize(pAig->vCos);
    bVar5 = false;
    if (clk._4_4_ < iVar1) {
      _status = Gia_ManCo(pAig,clk._4_4_);
      bVar5 = _status != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    Vec_IntClear(p_01->vCex);
    Bar_ProgressUpdate(p_02,clk._4_4_,"SAT...");
    pGVar3 = Gia_ObjFanin0(_status);
    iVar1 = Gia_ObjIsConst0(pGVar3);
    if (iVar1 == 0) {
      pGVar3 = Gia_ObjChild0(_status);
      iVar1 = Cec_ManSatCheckNode(p_01,pGVar3);
      Vec_StrPush(p_00,(char)iVar1);
      if (iVar1 == -1) {
        Cec_ManSatAddToStore(vCexStore_00,(Vec_Int_t *)0x0,clk._4_4_);
      }
      else if (iVar1 != 1) {
        if (iVar1 != 0) {
          __assert_fail("status == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecSolve.c"
                        ,0x431,
                        "Vec_Int_t *Cec_ManSatSolveMiter(Gia_Man_t *, Cec_ParSat_t *, Vec_Str_t **)"
                       );
        }
        pGVar3 = Gia_ObjFanin0(_status);
        Cec_ManSavePattern(p_01,pGVar3,(Gia_Obj_t *)0x0);
        Cec_ManSatAddToStore(vCexStore_00,p_01->vCex,clk._4_4_);
      }
    }
    else {
      iVar1 = Gia_ObjFaninC0(_status);
      if (iVar1 == 0) {
        Vec_StrPush(p_00,'\x01');
      }
      else {
        Cec_ManSatAddToStore(vCexStore_00,p_01->vCex,clk._4_4_);
        Vec_StrPush(p_00,'\0');
      }
    }
    clk._4_4_ = clk._4_4_ + 1;
  }
  aVar4 = Abc_Clock();
  p_01->timeTotal = (int)aVar4 - (int)aVar2;
  Bar_ProgressStop(p_02);
  Cec_ManSatStop(p_01);
  *pvStatus = p_00;
  return vCexStore_00;
}

Assistant:

Vec_Int_t * Cec_ManSatSolveMiter( Gia_Man_t * pAig, Cec_ParSat_t * pPars, Vec_Str_t ** pvStatus )
{
    Bar_Progress_t * pProgress = NULL;
    Vec_Int_t * vCexStore;
    Vec_Str_t * vStatus;
    Cec_ManSat_t * p;
    Gia_Obj_t * pObj;
    int i, status;
    abctime clk = Abc_Clock();
    // prepare AIG
    Gia_ManSetPhase( pAig );
    Gia_ManLevelNum( pAig );
    Gia_ManIncrementTravId( pAig );
    // create resulting data-structures
    vStatus = Vec_StrAlloc( Gia_ManPoNum(pAig) );
    vCexStore = Vec_IntAlloc( 10000 );
    // perform solving
    p = Cec_ManSatCreate( pAig, pPars );
    pProgress = Bar_ProgressStart( stdout, Gia_ManPoNum(pAig) );
    Gia_ManForEachCo( pAig, pObj, i )
    {
        Vec_IntClear( p->vCex );
        Bar_ProgressUpdate( pProgress, i, "SAT..." );
        if ( Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) )
        {
            if ( Gia_ObjFaninC0(pObj) )
            {
//                Abc_Print( 1, "Constant 1 output of SRM!!!\n" );
                Cec_ManSatAddToStore( vCexStore, p->vCex, i ); // trivial counter-example
                Vec_StrPush( vStatus, 0 );
            }
            else
            {
//                Abc_Print( 1, "Constant 0 output of SRM!!!\n" );
                Vec_StrPush( vStatus, 1 );
            }
            continue;
        }
        status = Cec_ManSatCheckNode( p, Gia_ObjChild0(pObj) );
        Vec_StrPush( vStatus, (char)status );
        if ( status == -1 )
        {
            Cec_ManSatAddToStore( vCexStore, NULL, i ); // timeout
            continue;
        }
        if ( status == 1 )
            continue;
        assert( status == 0 );
        // save the pattern
//        Gia_ManIncrementTravId( pAig );
//        Cec_ManSatSolveMiter_rec( p, pAig, Gia_ObjFanin0(pObj) );
        Cec_ManSavePattern( p, Gia_ObjFanin0(pObj), NULL );
//        Gia_SatVerifyPattern( pAig, pObj, p->vCex, p->vVisits );
        Cec_ManSatAddToStore( vCexStore, p->vCex, i );
    }
    p->timeTotal = Abc_Clock() - clk;
    Bar_ProgressStop( pProgress );
//    if ( pPars->fVerbose )
//        Cec_ManSatPrintStats( p );
    Cec_ManSatStop( p );
    *pvStatus = vStatus;
    return vCexStore;
}